

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void sgai_bin_offset(int scope,int *x,int n,int *offset)

{
  int iVar1;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  int unaff_retaddr;
  int me;
  int i;
  int tag;
  int lenmes;
  int len;
  int right;
  int left;
  int up;
  int root;
  Integer in_stack_00000158;
  char *in_stack_00000160;
  int local_40;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = armci_msg_me();
  if (in_RSI == 0) {
    pnga_error(in_stack_00000160,in_stack_00000158);
  }
  if (2000 < in_EDX) {
    pnga_error(in_stack_00000160,in_stack_00000158);
  }
  armci_msg_bintree((int)((ulong)in_RSI >> 0x20),(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                    in_RCX,(int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (-1 < in_stack_ffffffffffffffd4) {
    armci_msg_rcv(root,_right,len,_i,me);
  }
  if (-1 < in_stack_ffffffffffffffd0) {
    armci_msg_rcv(root,_right,len,_i,me);
  }
  if ((in_stack_ffffffffffffffd0 < 0) || (in_stack_ffffffffffffffd4 < 0)) {
    if (in_stack_ffffffffffffffd4 < 0) {
      for (local_40 = 0; local_40 < in_EDX; local_40 = local_40 + 1) {
        workL[local_40] = *(int *)(in_RSI + (long)local_40 * 4);
      }
    }
    else {
      for (local_40 = 0; local_40 < in_EDX; local_40 = local_40 + 1) {
        workL[local_40] = *(int *)(in_RSI + (long)local_40 * 4) + workL[local_40];
      }
    }
  }
  else {
    for (local_40 = 0; local_40 < in_EDX; local_40 = local_40 + 1) {
      workL[local_40] = workR[local_40] + *(int *)(in_RSI + (long)local_40 * 4) + workL[local_40];
    }
  }
  if ((iVar1 != in_stack_ffffffffffffffdc) && (in_stack_ffffffffffffffd8 != -1)) {
    armci_msg_snd(len,_i,me,unaff_retaddr);
  }
  if ((iVar1 != in_stack_ffffffffffffffdc) && (in_stack_ffffffffffffffd8 != -1)) {
    armci_msg_rcv(root,_right,len,_i,me);
  }
  for (local_40 = 0; local_40 < in_EDX; local_40 = local_40 + 1) {
    in_RCX[local_40] = workL[local_40] - *(int *)(in_RSI + (long)local_40 * 4);
  }
  if (-1 < in_stack_ffffffffffffffd0) {
    armci_msg_snd(len,_i,me,unaff_retaddr);
  }
  if (-1 < in_stack_ffffffffffffffd4) {
    for (local_40 = 0; local_40 < in_EDX; local_40 = local_40 + 1) {
      workR[local_40] = in_RCX[local_40] - workR[local_40];
    }
    armci_msg_snd(len,_i,me,unaff_retaddr);
  }
  return;
}

Assistant:

static void sgai_bin_offset(int scope, int *x, int n, int *offset)
{
int root, up, left, right;
int len, lenmes, tag=32100, i, me=armci_msg_me();

    if(!x)pnga_error("sgai_bin_offset: NULL pointer", n);
    if(n>NWORK)pnga_error("sgai_bin_offset: >NWORK", n);
    len = sizeof(int)*n;

    armci_msg_bintree(scope, &root, &up, &left, &right);

    /* up-tree phase: collect number of elements */
    if (left > -1) armci_msg_rcv(tag, workL, len, &lenmes, left);
    if (right > -1) armci_msg_rcv(tag, workR, len, &lenmes, right);

    /* add number of elements in each bin */
    if((right > -1) && left>-1) for(i=0;i<n;i++)workL[i] += workR[i] +x[i];
    else if(left > -1) for(i=0;i<n;i++)workL[i] += x[i];
    else for(i=0;i<n;i++)workL[i] = x[i]; 

    /* now, workL on root contains the number of elements in each bin*/
         
    if (me != root && up!=-1) armci_msg_snd(tag, workL, len, up);

    /* down-tree: compute offset subtracting elements for self and right leaf*/
    if (me != root && up!=-1){
             armci_msg_rcv(tag, workL, len, &lenmes, up);
    }
    for(i=0; i<n; i++) offset[i] = workL[i]-x[i];

    if (right > -1) armci_msg_snd(tag, offset, len, right);
    if (left > -1) {
            /* we saved num elems for right subtree to adjust offset for left*/
            for(i=0; i<n; i++) workR[i] = offset[i] -workR[i]; 
            armci_msg_snd(tag, workR, len, left);
    }
/*    printf("%d:left=%d right=%d up=%d root=%d off=%d\n",me,left, right,up,root,offset[0]);
    fflush(stdout);
*/
}